

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O2

int __thiscall btConvexHullInternal::Int128::ucmp(Int128 *this,Int128 *b)

{
  if (b->high <= this->high) {
    if (b->high < this->high) {
      return 1;
    }
    if (b->low <= this->low) {
      return (int)(b->low < this->low);
    }
  }
  return -1;
}

Assistant:

int ucmp(const Int128&b) const
				{
					if (high < b.high)
					{
						return -1;
					}
					if (high > b.high)
					{
						return 1;
					}
					if (low < b.low)
					{
						return -1;
					}
					if (low > b.low)
					{
						return 1;
					}
					return 0;
				}